

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.h
# Opt level: O2

bool __thiscall WebServer::existUser(WebServer *this,string *user)

{
  iterator iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->users)._M_h,user);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return iVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool existUser(const std::string& user) { MutexLockGuard lock(mutex_); return users.find(user) != users.end(); }